

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void cmsysProcess_SetTimeout(cmsysProcess *cp,double timeout)

{
  double dVar1;
  
  if (cp != (cmsysProcess *)0x0) {
    dVar1 = 0.0;
    if (0.0 <= timeout) {
      dVar1 = timeout;
    }
    cp->Timeout = dVar1;
    (cp->TimeoutTime).tv_sec = -1;
  }
  return;
}

Assistant:

void kwsysProcess_SetTimeout(kwsysProcess* cp, double timeout)
{
  if (!cp) {
    return;
  }
  cp->Timeout = timeout;
  if (cp->Timeout < 0) {
    cp->Timeout = 0;
  }
  // Force recomputation of TimeoutTime.
  cp->TimeoutTime.tv_sec = -1;
}